

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

bool __thiscall blc::network::Socket::waitRead(Socket *this,uint usec)

{
  uint __i;
  int iVar1;
  long lVar2;
  timeval timeout;
  fd_set fds;
  
  timeout.tv_sec = 0;
  timeout.tv_usec = (__suseconds_t)usec;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fds.fds_bits[lVar2] = 0;
  }
  iVar1 = this->_socket;
  fds.fds_bits[iVar1 / 0x40] = fds.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
  iVar1 = select(iVar1 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
  return 0 < iVar1;
}

Assistant:

bool blc::network::Socket::waitRead(unsigned int usec) const {
	fd_set fds;
	#ifdef __WIN32
		struct timeval timeout = {0, static_cast<int32_t>(usec)};
	#elif __APPLE__
		struct timeval timeout = {0, static_cast<int32_t>(usec)};
	#else
		struct timeval timeout = {0, reinterpret_cast<unsigned int>(usec)};
	#endif

	FD_ZERO(&fds);
	FD_SET(this->_socket, &fds);
	if (select(this->_socket + 1, &fds, 0, 0, &timeout) <= 0)
		return (false);
	return (true);
}